

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

String * __thiscall
Json::valueToQuotedStringN_abi_cxx11_
          (String *__return_storage_ptr__,Json *this,char *value,uint length,bool emitUTF8)

{
  Json *pJVar1;
  Json JVar2;
  uint uVar3;
  char *cur;
  Json *pJVar4;
  uint x;
  uint x_00;
  uint x_01;
  Json *pJVar5;
  uint uVar6;
  bool bVar7;
  allocator<char> local_75;
  uint local_74;
  String local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_74 = length;
  if (this == (Json *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_70);
  }
  else {
    pJVar5 = this + ((ulong)value & 0xffffffff);
    pJVar4 = this;
    do {
      if (pJVar5 <= pJVar4) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\"",&local_75);
        std::operator+(&local_70,&local_50,(char *)this);
        std::operator+(__return_storage_ptr__,&local_70,"\"");
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        return __return_storage_ptr__;
      }
      JVar2 = *pJVar4;
    } while (((JVar2 != (Json)0x22) && (JVar2 != (Json)0x5c)) &&
            (pJVar4 = pJVar4 + 1, '\x1f' < (char)JVar2));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (; this != pJVar5; this = this + 1) {
      JVar2 = *this;
      uVar3 = (uint)(byte)JVar2;
      switch(JVar2) {
      case (Json)0x8:
        break;
      case (Json)0x9:
        break;
      case (Json)0xa:
        break;
      case (Json)0xb:
switchD_0010fe3e_caseD_b:
        if ((char)local_74 == '\0') {
          if ((char)JVar2 < '\0') {
            if ((byte)JVar2 < 0xe0) {
              pJVar4 = (Json *)0xfffd;
              if (1 < (long)pJVar5 - (long)this) {
                uVar6 = (uVar3 & 0x1f) << 6;
                pJVar4 = this + 1;
                this = this + 1;
                uVar3 = (byte)*pJVar4 & 0x3f | uVar6;
                if (uVar6 < 0x80) {
                  uVar3 = 0xfffd;
                }
                goto LAB_0010feb1;
              }
            }
            else if ((byte)JVar2 < 0xf0) {
              pJVar4 = (Json *)0xfffd;
              if (2 < (long)pJVar5 - (long)this) {
                uVar3 = (uVar3 & 0xf) << 0xc;
                uVar6 = ((byte)this[1] & 0x3f) << 6 | uVar3;
                this = this + 2;
                if ((0xdfff < uVar3) || (uVar6 < 0xd800)) {
                  uVar3 = (byte)*this & 0x3f | uVar6;
                  bVar7 = uVar6 < 0x800;
                  goto LAB_00110085;
                }
              }
            }
            else {
              pJVar4 = (Json *)0xfffd;
              if (3 < (long)pJVar5 - (long)this && (byte)JVar2 < 0xf8) {
                uVar6 = ((byte)this[1] & 0x3f) << 0xc | (uVar3 & 7) << 0x12;
                pJVar4 = this + 2;
                pJVar1 = this + 3;
                this = this + 3;
                uVar3 = (byte)*pJVar1 & 0x3f | ((byte)*pJVar4 & 0x3f) << 6 | uVar6;
                bVar7 = uVar6 < 0x10000;
LAB_00110085:
                if (bVar7) {
                  uVar3 = 0xfffd;
                }
                goto LAB_0010feb1;
              }
            }
LAB_00110015:
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            toHex16Bit_abi_cxx11_(&local_70,pJVar4,x_01);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          else {
LAB_0010feb1:
            if (uVar3 - 0x20 < 0x60) {
              std::__cxx11::string::push_back((char)__return_storage_ptr__);
              goto LAB_0010fea4;
            }
            if (uVar3 < 0x10000) {
              pJVar4 = (Json *)(ulong)uVar3;
              goto LAB_00110015;
            }
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            toHex16Bit_abi_cxx11_(&local_70,(Json *)(ulong)((uVar3 - 0x10000 >> 10) + 0xd800),x);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            toHex16Bit_abi_cxx11_(&local_70,(Json *)(ulong)(uVar3 & 0x3ff | 0xdc00),x_00);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          std::__cxx11::string::~string((string *)&local_70);
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        goto LAB_0010fea4;
      case (Json)0xc:
        break;
      case (Json)0xd:
        break;
      default:
        if ((JVar2 != (Json)0x5c) && (JVar2 != (Json)0x22)) goto switchD_0010fe3e_caseD_b;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0010fea4:
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static String valueToQuotedStringN(const char* value, unsigned length,
                                   bool emitUTF8 = false) {
  if (value == nullptr)
    return "";

  if (!isAnyCharRequiredQuoting(value, length))
    return String("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to String is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  String::size_type maxsize = length * 2 + 3; // allescaped+quotes+NULL
  String result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default: {
      if (emitUTF8) {
        result += *c;
      } else {
        unsigned int codepoint = utf8ToCodepoint(c, end);
        const unsigned int FIRST_NON_CONTROL_CODEPOINT = 0x20;
        const unsigned int LAST_NON_CONTROL_CODEPOINT = 0x7F;
        const unsigned int FIRST_SURROGATE_PAIR_CODEPOINT = 0x10000;
        // don't escape non-control characters
        // (short escape sequence are applied above)
        if (FIRST_NON_CONTROL_CODEPOINT <= codepoint &&
            codepoint <= LAST_NON_CONTROL_CODEPOINT) {
          result += static_cast<char>(codepoint);
        } else if (codepoint <
                   FIRST_SURROGATE_PAIR_CODEPOINT) { // codepoint is in Basic
                                                     // Multilingual Plane
          result += "\\u";
          result += toHex16Bit(codepoint);
        } else { // codepoint is not in Basic Multilingual Plane
                 // convert to surrogate pair first
          codepoint -= FIRST_SURROGATE_PAIR_CODEPOINT;
          result += "\\u";
          result += toHex16Bit((codepoint >> 10) + 0xD800);
          result += "\\u";
          result += toHex16Bit((codepoint & 0x3FF) + 0xDC00);
        }
      }
    } break;
    }
  }
  result += "\"";
  return result;
}